

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O2

void __thiscall
blcl::net::server_interface<MsgType>::update
          (server_interface<MsgType> *this,size_t max_message_count,bool wait)

{
  undefined7 in_register_00000011;
  bool bVar1;
  owned_message<MsgType> msg;
  __shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> local_70;
  owned_message<MsgType> local_60;
  
  if ((int)CONCAT71(in_register_00000011,wait) != 0) {
    tsqueue<blcl::net::owned_message<MsgType>_>::wait
              (&this->incoming_messages_,(void *)max_message_count);
  }
  while( true ) {
    bVar1 = max_message_count == 0;
    max_message_count = max_message_count - 1;
    if (bVar1) {
      return;
    }
    bVar1 = tsqueue<blcl::net::owned_message<MsgType>_>::empty(&this->incoming_messages_);
    if (bVar1) break;
    tsqueue<blcl::net::owned_message<MsgType>_>::pop_front(&local_60,&this->incoming_messages_);
    std::__shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,
               (__shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> *)&local_60
              );
    (*this->_vptr_server_interface[4])(this,&local_70,&local_60.msg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    owned_message<MsgType>::~owned_message(&local_60);
  }
  return;
}

Assistant:

void update(size_t max_message_count = -1, bool wait = true) {
            if (wait)
                incoming_messages_.wait();

            size_t message_count = 0;
            while (message_count < max_message_count && !incoming_messages_.empty()) {
                auto msg = incoming_messages_.pop_front();
                on_message(msg.remote, msg.msg);
                message_count++;
            }
        }